

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

bool __thiscall
crnlib::rg_etc1::etc1_optimizer::evaluate_solution_fast
          (etc1_optimizer *this,etc1_solution_coordinates *coords,potential_solution *trial_solution
          ,potential_solution *pBest_solution)

{
  int iVar1;
  uint uVar2;
  long in_RCX;
  color_quad_u8 *in_RDX;
  color_quad_u8 *in_RSI;
  color_quad_u8 *in_RDI;
  bool success;
  uint sorted_pixel_index_1;
  uint sorted_pixel_index;
  uint y;
  uint c_2;
  uint cur_selector;
  uint c_1;
  uint min_error_1;
  uint c;
  uint min_error;
  color_quad_u8 *pSrc_pixels;
  uint64 total_error;
  uint block_inten_midpoints [3];
  color_quad_u8 block_color;
  int yd;
  uint s;
  color_quad_u8 block_colors [4];
  uint block_inten [4];
  int *pInten_table;
  int inten_table;
  uint n;
  color_quad_u8 base_color;
  int db;
  int dg;
  int dr;
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 *in_stack_ffffffffffffff28;
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 *in_stack_ffffffffffffff30;
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 *c_00;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_98;
  ulong local_88;
  uint local_80 [3];
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 local_74;
  undefined4 local_70;
  uint local_6c;
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 local_68 [4];
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 local_58;
  int local_54;
  int local_50;
  uint local_4c;
  undefined1 *local_48;
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 local_40;
  undefined4 local_3c;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  color_quad_u8 *local_20;
  color_quad_u8 *local_18;
  bool local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if ((*(byte *)(*(long *)in_RDI + 0x30) & 1) != 0) {
    local_2c = (uint)(in_RSI->field_0).field_0.r - (uint)*(byte *)(*(long *)in_RDI + 0x2c);
    local_30 = (uint)(in_RSI->field_0).field_0.g - (uint)*(byte *)(*(long *)in_RDI + 0x2d);
    local_34 = (uint)(in_RSI->field_0).field_0.b - (uint)*(byte *)(*(long *)in_RDI + 0x2e);
    iVar1 = minimum<int>((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                         (int)in_stack_ffffffffffffff30,
                         (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    if ((iVar1 < -4) ||
       (iVar1 = maximum<int>((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                             (int)in_stack_ffffffffffffff30,
                             (int)((ulong)in_stack_ffffffffffffff28 >> 0x20)), 3 < iVar1)) {
      local_20[8].field_0.field_0.r = '\0';
      return false;
    }
  }
  etc1_solution_coordinates::get_scaled_color
            ((etc1_solution_coordinates *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  local_3c = 8;
  *(undefined8 *)(local_20 + 6) = 0xffffffffffffffff;
  for (local_40.m_u32 = 7; -1 < (int)local_40.m_u32; local_40.m_u32 = local_40.m_u32 - 1) {
    local_48 = g_etc1_inten_tables + (long)(int)local_40.m_u32 * 0x10;
    in_stack_ffffffffffffff30 = &local_58;
    c_00 = local_68;
    do {
      in_stack_ffffffffffffff28 = c_00;
      color_quad_u8::color_quad_u8((color_quad_u8 *)&in_stack_ffffffffffffff28->field_0);
      c_00 = (anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)
             (&in_stack_ffffffffffffff28->field_0 + 1);
    } while (c_00 != in_stack_ffffffffffffff30);
    for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
      local_70 = *(undefined4 *)(local_48 + (ulong)local_6c * 4);
      color_quad_u8::color_quad_u8
                ((color_quad_u8 *)&in_stack_ffffffffffffff30->field_0,
                 (parameter_t)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                 (parameter_t)in_stack_ffffffffffffff28,0,0x229f1b);
      color_quad_u8::operator=
                ((color_quad_u8 *)(local_68[0].c + (ulong)local_6c * 4),
                 (color_quad_u8 *)&local_74.field_0);
      (&local_58)[local_6c].m_u32 =
           (uint)local_74.field_0.r + (uint)local_74.field_0.g + (uint)local_74.field_0.b;
    }
    local_80[0] = local_58.m_u32 + local_54;
    local_80[1] = local_54 + local_50;
    local_80[2] = local_50 + local_4c;
    local_88 = 0;
    if ((uint)(*(int *)(*(long *)(in_RDI + 0x22) + 0x1c) << 1) < local_58.m_u32 + local_54) {
      if ((local_58.m_u32 <= *(uint *)(*(long *)(in_RDI + 0x22) + 0x1c)) ||
         ((ulong)(local_58.m_u32 - *(int *)(*(long *)(in_RDI + 0x22) + 0x1c)) <
          *(ulong *)(local_20 + 6))) {
        memset(in_RDI + 0x3c,0,8);
        for (local_98 = 0; local_98 < 8; local_98 = local_98 + 1) {
          uVar2 = color_quad_u8::squared_distance_rgb(in_RDI,(color_quad_u8 *)&c_00->field_0);
          local_88 = uVar2 + local_88;
        }
        goto LAB_0022a264;
      }
    }
    else {
      if ((uint)(**(int **)(in_RDI + 0x22) << 1) < local_50 + local_4c) {
        local_a4 = 0;
        for (local_a8 = 0; local_a8 < 8; local_a8 = local_a8 + 1) {
          while (local_80[local_a4] <=
                 (uint)(*(int *)(*(long *)(in_RDI + 0x22) + (ulong)local_a8 * 4) << 1)) {
            local_a4 = local_a4 + 1;
            if (2 < local_a4) goto LAB_0022a1ff;
          }
          in_RDI[0x3c].field_0.c[*(uint *)(*(long *)(in_RDI + 0x20) + (ulong)local_a8 * 4)] =
               (component_t)local_a4;
          uVar2 = color_quad_u8::squared_distance_rgb(in_RDI,(color_quad_u8 *)&c_00->field_0);
          local_88 = uVar2 + local_88;
        }
LAB_0022a1ff:
        for (; local_a8 < 8; local_a8 = local_a8 + 1) {
          in_RDI[0x3c].field_0.c[*(uint *)(*(long *)(in_RDI + 0x20) + (ulong)local_a8 * 4)] = '\x03'
          ;
          uVar2 = color_quad_u8::squared_distance_rgb(in_RDI,(color_quad_u8 *)&c_00->field_0);
          local_88 = uVar2 + local_88;
        }
      }
      else {
        if ((local_4c < **(uint **)(in_RDI + 0x22)) &&
           (*(ulong *)(local_20 + 6) <= (ulong)(**(int **)(in_RDI + 0x22) - local_4c)))
        goto LAB_0022a2cc;
        memset(in_RDI + 0x3c,3,8);
        for (local_a0 = 0; local_a0 < 8; local_a0 = local_a0 + 1) {
          uVar2 = color_quad_u8::squared_distance_rgb(in_RDI,(color_quad_u8 *)&c_00->field_0);
          local_88 = uVar2 + local_88;
        }
      }
LAB_0022a264:
      if (local_88 < *(ulong *)(local_20 + 6)) {
        *(ulong *)(local_20 + 6) = local_88;
        local_20[1].field_0 = local_40;
        *(long *)(local_20 + 3) = *(long *)(in_RDI + 0x3c);
        local_20[8].field_0.field_0.r = '\x01';
        if (local_88 == 0) break;
      }
    }
LAB_0022a2cc:
  }
  color_quad_u8::operator=(local_20,local_18);
  local_20[2].field_0.field_0.r = *(byte *)(*(long *)in_RDI + 0x18) & 1;
  local_1 = false;
  if ((local_28 != 0) && (local_1 = *(ulong *)(local_20 + 6) < *(ulong *)(local_28 + 0x18), local_1)
     ) {
    potential_solution::operator=
              ((potential_solution *)&in_stack_ffffffffffffff30->field_0,
               (potential_solution *)&in_stack_ffffffffffffff28->field_0);
  }
  return local_1;
}

Assistant:

bool etc1_optimizer::evaluate_solution_fast(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution) {
  if (m_pParams->m_constrain_against_base_color5) {
    const int dr = coords.m_unscaled_color.r - m_pParams->m_base_color5.r;
    const int dg = coords.m_unscaled_color.g - m_pParams->m_base_color5.g;
    const int db = coords.m_unscaled_color.b - m_pParams->m_base_color5.b;

    if ((rg_etc1::minimum(dr, dg, db) < cETC1ColorDeltaMin) || (rg_etc1::maximum(dr, dg, db) > cETC1ColorDeltaMax)) {
      trial_solution.m_valid = false;
      return false;
    }
  }

  const color_quad_u8 base_color(coords.get_scaled_color());

  const uint n = 8;

  trial_solution.m_error = cUINT64_MAX;

  for (int inten_table = cETC1IntenModifierValues - 1; inten_table >= 0; --inten_table) {
    const int* pInten_table = g_etc1_inten_tables[inten_table];

    uint block_inten[4];
    color_quad_u8 block_colors[4];
    for (uint s = 0; s < 4; s++) {
      const int yd = pInten_table[s];
      color_quad_u8 block_color(base_color.r + yd, base_color.g + yd, base_color.b + yd, 0);
      block_colors[s] = block_color;
      block_inten[s] = block_color.r + block_color.g + block_color.b;
    }

    // evaluate_solution_fast() enforces/assumesd a total ordering of the input colors along the intensity (1,1,1) axis to more quickly classify the inputs to selectors.
    // The inputs colors have been presorted along the projection onto this axis, and ETC1 block colors are always ordered along the intensity axis, so this classification is fast.
    // 0   1   2   3
    //   01  12  23
    const uint block_inten_midpoints[3] = {block_inten[0] + block_inten[1], block_inten[1] + block_inten[2], block_inten[2] + block_inten[3]};

    uint64 total_error = 0;
    const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
    if ((m_pSorted_luma[n - 1] * 2) < block_inten_midpoints[0]) {
      if (block_inten[0] > m_pSorted_luma[n - 1]) {
        const uint min_error = block_inten[0] - m_pSorted_luma[n - 1];
        if (min_error >= trial_solution.m_error)
          continue;
      }

      memset(&m_temp_selectors[0], 0, n);

      for (uint c = 0; c < n; c++)
        total_error += block_colors[0].squared_distance_rgb(pSrc_pixels[c]);
    } else if ((m_pSorted_luma[0] * 2) >= block_inten_midpoints[2]) {
      if (m_pSorted_luma[0] > block_inten[3]) {
        const uint min_error = m_pSorted_luma[0] - block_inten[3];
        if (min_error >= trial_solution.m_error)
          continue;
      }

      memset(&m_temp_selectors[0], 3, n);

      for (uint c = 0; c < n; c++)
        total_error += block_colors[3].squared_distance_rgb(pSrc_pixels[c]);
    } else {
      uint cur_selector = 0, c;
      for (c = 0; c < n; c++) {
        const uint y = m_pSorted_luma[c];
        while ((y * 2) >= block_inten_midpoints[cur_selector])
          if (++cur_selector > 2)
            goto done;
        const uint sorted_pixel_index = m_pSorted_luma_indices[c];
        m_temp_selectors[sorted_pixel_index] = static_cast<uint8>(cur_selector);
        total_error += block_colors[cur_selector].squared_distance_rgb(pSrc_pixels[sorted_pixel_index]);
      }
    done:
      while (c < n) {
        const uint sorted_pixel_index = m_pSorted_luma_indices[c];
        m_temp_selectors[sorted_pixel_index] = 3;
        total_error += block_colors[3].squared_distance_rgb(pSrc_pixels[sorted_pixel_index]);
        ++c;
      }
    }

    if (total_error < trial_solution.m_error) {
      trial_solution.m_error = total_error;
      trial_solution.m_coords.m_inten_table = inten_table;
      memcpy(trial_solution.m_selectors, m_temp_selectors, n);
      trial_solution.m_valid = true;
      if (!total_error)
        break;
    }
  }
  trial_solution.m_coords.m_unscaled_color = coords.m_unscaled_color;
  trial_solution.m_coords.m_color4 = m_pParams->m_use_color4;

  bool success = false;
  if (pBest_solution) {
    if (trial_solution.m_error < pBest_solution->m_error) {
      *pBest_solution = trial_solution;
      success = true;
    }
  }

  return success;
}